

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O0

uint8_t SrgbTransform::linearToSrgb8bit(float x)

{
  int *piVar1;
  int local_34 [7];
  int i;
  int y;
  float *TABLE;
  float x_local;
  
  if (0.0 < x) {
    if (x < 1.0) {
      _i = SRGB_8BIT_TO_LINEAR_FLOAT;
      local_34[6] = 0;
      for (local_34[5] = 0x80; local_34[5] != 0; local_34[5] = local_34[5] >> 1) {
        if (*(float *)(SRGB_8BIT_TO_LINEAR_FLOAT + (long)(local_34[6] + local_34[5]) * 4) <= x) {
          local_34[6] = local_34[5] + local_34[6];
        }
      }
      TABLE._0_4_ = x;
      if (*(float *)(SRGB_8BIT_TO_LINEAR_FLOAT + (long)(local_34[6] + 1) * 4) - x <
          x - *(float *)(SRGB_8BIT_TO_LINEAR_FLOAT + (long)local_34[6] * 4)) {
        local_34[2] = 0;
        local_34[1] = 0xff;
        local_34[0] = local_34[6] + 1;
        piVar1 = std::min<int>(local_34 + 1,local_34);
        piVar1 = std::max<int>(local_34 + 2,piVar1);
        TABLE._7_1_ = (uint8_t)*piVar1;
      }
      else {
        local_34[4] = 0;
        local_34[3] = 0xff;
        piVar1 = std::min<int>(local_34 + 3,local_34 + 6);
        piVar1 = std::max<int>(local_34 + 4,piVar1);
        TABLE._7_1_ = (uint8_t)*piVar1;
      }
    }
    else {
      TABLE._7_1_ = 0xff;
    }
  }
  else {
    TABLE._7_1_ = '\0';
  }
  return TABLE._7_1_;
}

Assistant:

uint8_t linearToSrgb8bit(float x) {
	if (x <= 0.0f)
		return 0;
	if (x >= 1.0f)
		return 255;
	const float *TABLE = SRGB_8BIT_TO_LINEAR_FLOAT;
	int y = 0;
	for (int i = 128; i != 0; i >>= 1) {
		if (TABLE[y + i] <= x)
			y += i;
	}
	if (x - TABLE[y] <= TABLE[y + 1] - x)
		return static_cast<uint8_t>((std::max)(0, (std::min)(255, y)));
	else
		return static_cast<uint8_t>((std::max)(0, (std::min)(255, y + 1)));
}